

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BVH.cpp
# Opt level: O2

double SimpleBVH::anon_unknown_6::point_box_signed_squared_distance
                 (VectorMax3d *p,array<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_2UL> *B)

{
  DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_0> *this;
  double dVar1;
  double dVar2;
  CoeffReturnType pdVar3;
  DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_0> *this_00;
  int c;
  long index;
  long lVar4;
  bool bVar5;
  undefined4 uVar6;
  double local_58;
  undefined1 local_48 [12];
  undefined4 uStack_3c;
  
  lVar4 = (p->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage.m_rows;
  if (lVar4 != B->_M_elems[0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
               m_storage.m_rows) {
    __assert_fail("p.size() == B[0].size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/geometryprocessing[P]SimpleBVH/src/SimpleBVH/BVH.cpp"
                  ,0x9f,
                  "double SimpleBVH::(anonymous namespace)::point_box_signed_squared_distance(const VectorMax3d &, const std::array<VectorMax3d, 2> &)"
                 );
  }
  this = (DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_0> *)(B->_M_elems + 1);
  _local_48 = ZEXT816(0);
  bVar5 = true;
  index = 0;
  do {
    if (lVar4 <= index) {
      if (bVar5) {
        if (lVar4 != B->_M_elems[0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                     m_storage.m_rows) {
          __assert_fail("p.size() == B[0].size()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/geometryprocessing[P]SimpleBVH/src/SimpleBVH/BVH.cpp"
                        ,0x91,
                        "double SimpleBVH::(anonymous namespace)::inner_point_box_squared_distance(const VectorMax3d &, const std::array<VectorMax3d, 2> &)"
                       );
        }
        pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_0>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_0> *)p,0);
        dVar1 = *pdVar3;
        pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_0>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_0> *)B,0);
        dVar2 = *pdVar3;
        pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_0>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_0> *)p,0);
        local_48._0_8_ = *pdVar3;
        local_48._8_4_ = SUB84(dVar1,0);
        uStack_3c = (int)((ulong)dVar1 >> 0x20);
        pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_0>::operator[]
                           (this,0);
        local_48._0_8_ = (double)local_48._0_8_ - *pdVar3;
        local_48._0_8_ = (double)local_48._0_8_ * (double)local_48._0_8_;
        register0x00001248 = (stack0xffffffffffffffc0 - dVar2) * (stack0xffffffffffffffc0 - dVar2);
        if (register0x00001248 <= (double)local_48._0_8_) {
          local_48._0_8_ = register0x00001248;
        }
        for (lVar4 = 1;
            lVar4 < (p->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage.
                    m_rows; lVar4 = lVar4 + 1) {
          pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_0>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_0> *)p,lVar4);
          dVar1 = *pdVar3;
          pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_0>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_0> *)B,lVar4);
          dVar1 = (dVar1 - *pdVar3) * (dVar1 - *pdVar3);
          if ((double)local_48._0_8_ <= dVar1) {
            dVar1 = (double)local_48._0_8_;
          }
          pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_0>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_0> *)p,lVar4);
          dVar2 = *pdVar3;
          pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_0>::operator[]
                             (this,lVar4);
          dVar2 = (dVar2 - *pdVar3) * (dVar2 - *pdVar3);
          if (dVar1 <= dVar2) {
            dVar2 = dVar1;
          }
          unique0x10000250 = 0.0;
          local_48._0_8_ = dVar2;
        }
        local_48._0_8_ = local_48._0_8_ ^ 0x8000000000000000;
      }
      return (double)local_48._0_8_;
    }
    pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_0> *)p,index);
    dVar1 = *pdVar3;
    pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_0> *)B,index);
    dVar2 = *pdVar3;
    pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_0> *)p,index);
    local_58 = *pdVar3;
    this_00 = (DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_0> *)B;
    if (dVar2 <= dVar1) {
      pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_0>::operator[]
                         (this,index);
      if (*pdVar3 <= local_58 && local_58 != *pdVar3) {
        pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_0>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_0> *)p,index);
        local_58 = *pdVar3;
        this_00 = this;
        goto LAB_0011752f;
      }
    }
    else {
LAB_0011752f:
      pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_0>::operator[]
                         (this_00,index);
      uVar6 = local_48._12_4_;
      local_48._8_4_ = local_48._8_4_;
      local_48._0_8_ = (double)local_48._0_8_ + (local_58 - *pdVar3) * (local_58 - *pdVar3);
      uStack_3c = uVar6;
      bVar5 = false;
    }
    index = index + 1;
    lVar4 = (p->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage.m_rows;
  } while( true );
}

Assistant:

double point_box_signed_squared_distance(
        const VectorMax3d& p, const std::array<VectorMax3d, 2>& B)
    {
        assert(p.size() == B[0].size());

        bool inside = true;
        double result = 0.0;
        for (int c = 0; c < p.size(); c++) {
            if (p[c] < B[0][c]) {
                inside = false;
                result += std::pow(p[c] - B[0][c], 2);
            } else if (p[c] > B[1][c]) {
                inside = false;
                result += std::pow(p[c] - B[1][c], 2);
            }
        }
        if (inside) {
            result = -inner_point_box_squared_distance(p, B);
        }
        return result;
    }